

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

void xmlDumpEntityContent(xmlBufferPtr buf,xmlChar *content)

{
  int iVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlChar *local_28;
  xmlChar *cur;
  xmlChar *base;
  xmlChar *content_local;
  xmlBufferPtr buf_local;
  
  if (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE) {
    pxVar3 = xmlStrchr(content,'%');
    if (pxVar3 == (xmlChar *)0x0) {
      xmlBufferWriteQuotedString(buf,content);
    }
    else {
      xmlBufferCCat(buf,"\"");
      local_28 = content;
      cur = content;
      while( true ) {
        iVar1 = (int)local_28;
        iVar2 = (int)cur;
        if (*local_28 == '\0') break;
        if (*local_28 == '\"') {
          if (cur != local_28) {
            xmlBufferAdd(buf,cur,iVar1 - iVar2);
          }
          xmlBufferAdd(buf,(xmlChar *)"&quot;",6);
          cur = local_28 + 1;
        }
        else if (*local_28 == '%') {
          if (cur != local_28) {
            xmlBufferAdd(buf,cur,iVar1 - iVar2);
          }
          xmlBufferAdd(buf,(xmlChar *)"&#x25;",6);
          cur = local_28 + 1;
        }
        local_28 = local_28 + 1;
      }
      if (cur != local_28) {
        xmlBufferAdd(buf,cur,iVar1 - iVar2);
      }
      xmlBufferCCat(buf,"\"");
    }
  }
  return;
}

Assistant:

static void
xmlDumpEntityContent(xmlBufferPtr buf, const xmlChar *content) {
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) return;
    if (xmlStrchr(content, '%')) {
        const xmlChar * base, *cur;

	xmlBufferCCat(buf, "\"");
	base = cur = content;
	while (*cur != 0) {
	    if (*cur == '"') {
		if (base != cur)
		    xmlBufferAdd(buf, base, cur - base);
		xmlBufferAdd(buf, BAD_CAST "&quot;", 6);
		cur++;
		base = cur;
	    } else if (*cur == '%') {
		if (base != cur)
		    xmlBufferAdd(buf, base, cur - base);
		xmlBufferAdd(buf, BAD_CAST "&#x25;", 6);
		cur++;
		base = cur;
	    } else {
		cur++;
	    }
	}
	if (base != cur)
	    xmlBufferAdd(buf, base, cur - base);
	xmlBufferCCat(buf, "\"");
    } else {
        xmlBufferWriteQuotedString(buf, content);
    }
}